

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

_Bool upvalue_lookup(ch_compilation *comp,ch_scope *scope,ch_lexeme name,uint8_t *index)

{
  ch_lexeme name_00;
  _Bool _Var1;
  uint8_t uVar2;
  uint8_t local_3a;
  byte local_39;
  uint8_t upvalue;
  uint8_t *puStack_38;
  uint8_t offset;
  uint8_t *index_local;
  ch_scope *scope_local;
  ch_compilation *comp_local;
  ch_lexeme name_local;
  
  name_local.start = (char *)name.size;
  comp_local = (ch_compilation *)name.start;
  if (scope->parent == (ch_scope *)0x0) {
    name_local.size._7_1_ = false;
  }
  else {
    puStack_38 = index;
    index_local = (uint8_t *)scope;
    scope_local = (ch_scope *)comp;
    _Var1 = scope_lookup(scope->parent,name,&local_39);
    if (_Var1) {
      uVar2 = add_upvalue((ch_compilation *)scope_local,(ch_scope *)index_local,local_39,true);
      *puStack_38 = uVar2;
      *(undefined1 *)(*(long *)(index_local + 0x19e8) + (ulong)local_39 * 0x18 + 0x10) = 1;
      name_local.size._7_1_ = true;
    }
    else {
      name_00.size = (size_t)name_local.start;
      name_00.start = (char *)comp_local;
      _Var1 = upvalue_lookup((ch_compilation *)scope_local,*(ch_scope **)(index_local + 0x19e8),
                             name_00,&local_3a);
      if (_Var1) {
        uVar2 = add_upvalue((ch_compilation *)scope_local,(ch_scope *)index_local,local_3a,false);
        *puStack_38 = uVar2;
        name_local.size._7_1_ = true;
      }
      else {
        name_local.size._7_1_ = false;
      }
    }
  }
  return name_local.size._7_1_;
}

Assistant:

bool upvalue_lookup(ch_compilation* comp, ch_scope *scope, ch_lexeme name, uint8_t *index) {
  if (scope->parent == NULL) return false;

  uint8_t offset;
  if(scope_lookup(scope->parent, name, &offset)) {
    *index = add_upvalue(comp, scope, offset, true);
    scope->parent->locals[offset].is_captured = true;
    return true;
  }

  uint8_t upvalue;
  if(upvalue_lookup(comp, scope->parent, name, &upvalue)) {
    *index = add_upvalue(comp, scope, upvalue, false);
    return true;
  }

  return false;
}